

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_string_class.cpp
# Opt level: O2

void string_files(void)

{
  char cVar1;
  string item;
  ifstream file_input;
  
  std::ifstream::ifstream(&file_input);
  std::ifstream::open((char *)&file_input,0x120b77);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&std::cout,"open file successfully...\n");
  }
  std::operator<<((ostream *)&std::cerr,"Cannot open file...\n");
}

Assistant:

void string_files() {
    using namespace std;

    //  input file stream instance
    ifstream file_input;
    file_input.open("tobuy.txt");

    if (file_input.is_open() == false) {
        //  similar to "console.error" ?
        cerr << "Cannot open file...\n";
        exit(EXIT_FAILURE); // process.exit(x)
    } else {
        //  must create the file manually...
        cout << "open file successfully...\n";
    }

    string item;
    int count = 0;
    getline(file_input, item, ':');
    while(file_input) {
        ++count; // line count, split by ':' (by default it is '\n')
        cout << count << ": " << item << endl;
        //  can this turned to "do {} while" ?
        getline(file_input, item, ':');
    }

    cout << "Done!\n";
    file_input.close();
}